

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::DataParameter::SerializeWithCachedSizes(DataParameter *this,CodedOutputStream *output)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  DataParameter_DB value;
  char *pcVar5;
  string *psVar6;
  UnknownFieldSet *unknown_fields;
  float value_00;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  DataParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    source_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.DataParameter.source");
    psVar6 = source_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(1,psVar6,output);
  }
  if ((uVar1 & 0x100) != 0) {
    value_00 = scale(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(2,value_00,output);
  }
  if ((uVar1 & 2) != 0) {
    mean_file_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    mean_file_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar5,iVar3,SERIALIZE,"caffe.DataParameter.mean_file");
    psVar6 = mean_file_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(3,psVar6,output);
  }
  if ((uVar1 & 4) != 0) {
    uVar4 = batch_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(4,uVar4,output);
  }
  if ((uVar1 & 8) != 0) {
    uVar4 = crop_size(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(5,uVar4,output);
  }
  if ((uVar1 & 0x20) != 0) {
    bVar2 = mirror(this);
    google::protobuf::internal::WireFormatLite::WriteBool(6,bVar2,output);
  }
  if ((uVar1 & 0x10) != 0) {
    uVar4 = rand_skip(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(7,uVar4,output);
  }
  if ((uVar1 & 0x80) != 0) {
    value = backend(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(8,value,output);
  }
  if ((uVar1 & 0x40) != 0) {
    bVar2 = force_encoded_color(this);
    google::protobuf::internal::WireFormatLite::WriteBool(9,bVar2,output);
  }
  if ((uVar1 & 0x200) != 0) {
    uVar4 = prefetch(this);
    google::protobuf::internal::WireFormatLite::WriteUInt32(10,uVar4,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = DataParameter::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void DataParameter::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.DataParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string source = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.DataParameter.source");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->source(), output);
  }

  // optional float scale = 2 [default = 1];
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->scale(), output);
  }

  // optional string mean_file = 3;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->mean_file().data(), this->mean_file().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.DataParameter.mean_file");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      3, this->mean_file(), output);
  }

  // optional uint32 batch_size = 4;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(4, this->batch_size(), output);
  }

  // optional uint32 crop_size = 5 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(5, this->crop_size(), output);
  }

  // optional bool mirror = 6 [default = false];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(6, this->mirror(), output);
  }

  // optional uint32 rand_skip = 7 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(7, this->rand_skip(), output);
  }

  // optional .caffe.DataParameter.DB backend = 8 [default = LEVELDB];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      8, this->backend(), output);
  }

  // optional bool force_encoded_color = 9 [default = false];
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(9, this->force_encoded_color(), output);
  }

  // optional uint32 prefetch = 10 [default = 4];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(10, this->prefetch(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.DataParameter)
}